

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  int *piVar1;
  uint *puVar2;
  uchar uVar3;
  int iVar4;
  uchar *puVar5;
  char *line_buffer;
  uchar *__src;
  ulong uVar6;
  int iVar7;
  int data_len;
  int filter_type;
  byte bVar8;
  int iVar9;
  size_t __n;
  uint uVar10;
  ulong uVar12;
  int filter_type_00;
  int zlen;
  ulong local_70;
  uchar *local_68;
  int *local_60;
  uchar *local_58;
  ulong local_50;
  long local_48;
  size_t local_40;
  uint *local_38;
  ulong uVar11;
  
  uVar10 = n * x;
  uVar11 = (ulong)uVar10;
  if (stride_bytes == 0) {
    stride_bytes = uVar10;
  }
  iVar7 = -1;
  if (stbi_write_force_png_filter < 5) {
    iVar7 = stbi_write_force_png_filter;
  }
  data_len = (uVar10 + 1) * y;
  local_68 = pixels;
  puVar5 = (uchar *)malloc((long)data_len);
  if (puVar5 != (uchar *)0x0) {
    local_40 = (size_t)(int)uVar10;
    line_buffer = (char *)malloc(local_40);
    if (line_buffer == (char *)0x0) {
      free(puVar5);
    }
    else {
      local_70 = uVar11;
      local_60 = out_len;
      if (0 < y) {
        local_48 = (long)(int)(uVar10 + 1);
        local_50 = (ulong)(uint)y;
        uVar12 = 0;
        local_58 = puVar5;
        do {
          filter_type = iVar7;
          if (iVar7 < 0) {
            filter_type = 0;
            iVar9 = 0x7fffffff;
            filter_type_00 = 0;
            do {
              stbiw__encode_png_line
                        (local_68,stride_bytes,x,y,(int)uVar12,n,filter_type_00,line_buffer);
              iVar4 = 0;
              if (0 < (int)local_70) {
                uVar6 = 0;
                iVar4 = 0;
                do {
                  bVar8 = line_buffer[uVar6] >> 7;
                  iVar4 = iVar4 + (uint)(byte)((line_buffer[uVar6] ^ bVar8) - bVar8);
                  uVar6 = uVar6 + 1;
                } while (uVar11 != uVar6);
              }
              if (iVar4 < iVar9) {
                iVar9 = iVar4;
                filter_type = filter_type_00;
              }
              filter_type_00 = filter_type_00 + 1;
            } while (filter_type_00 != 5);
            uVar3 = '\x05';
            puVar5 = local_58;
            if (filter_type != 5) goto LAB_0011c796;
          }
          else {
LAB_0011c796:
            stbiw__encode_png_line(local_68,stride_bytes,x,y,(int)uVar12,n,filter_type,line_buffer);
            uVar3 = (uchar)filter_type;
          }
          puVar5[uVar12 * local_48] = uVar3;
          memcpy(puVar5 + uVar12 * local_48 + 1,line_buffer,local_40);
          uVar12 = uVar12 + 1;
        } while (uVar12 != local_50);
      }
      free(line_buffer);
      __src = stbi_zlib_compress(puVar5,data_len,&zlen,stbi_write_png_compression_level);
      free(puVar5);
      if (__src != (uchar *)0x0) {
        __n = (size_t)zlen;
        puVar5 = (uchar *)malloc(__n + 0x39);
        piVar1 = local_60;
        if (puVar5 != (uchar *)0x0) {
          *local_60 = (int)(__n + 0x39);
          puVar5[0] = 0x89;
          puVar5[1] = 'P';
          puVar5[2] = 'N';
          puVar5[3] = 'G';
          puVar5[4] = '\r';
          puVar5[5] = '\n';
          puVar5[6] = '\x1a';
          puVar5[7] = '\n';
          puVar5[8] = '\0';
          puVar5[9] = '\0';
          puVar5[10] = '\0';
          puVar5[0xb] = '\r';
          puVar5[0xc] = 'I';
          puVar5[0xd] = 'H';
          puVar5[0xe] = 'D';
          puVar5[0xf] = 'R';
          puVar5[0x10] = (uchar)((uint)x >> 0x18);
          puVar5[0x11] = (uchar)((uint)x >> 0x10);
          puVar5[0x12] = (uchar)((uint)x >> 8);
          puVar5[0x13] = (uchar)x;
          puVar5[0x14] = (uchar)((uint)y >> 0x18);
          puVar5[0x15] = (uchar)((uint)y >> 0x10);
          puVar5[0x16] = (uchar)((uint)y >> 8);
          puVar5[0x17] = (uchar)y;
          puVar5[0x18] = '\b';
          puVar5[0x19] = (&DAT_00164950)[(long)n * 4];
          puVar5[0x1a] = '\0';
          puVar5[0x1b] = '\0';
          local_38 = (uint *)(puVar5 + 0x1d);
          puVar5[0x1c] = '\0';
          stbiw__wpcrc((uchar **)&local_38,0xd);
          puVar2 = local_38;
          *local_38 = (uint)zlen >> 0x18 | (zlen & 0xff0000U) >> 8 | (zlen & 0xff00U) << 8 |
                      zlen << 0x18;
          local_38[1] = 0x54414449;
          local_38 = local_38 + 2;
          memmove(local_38,__src,__n);
          local_38 = (uint *)((long)puVar2 + __n + 8);
          free(__src);
          stbiw__wpcrc((uchar **)&local_38,zlen);
          *local_38 = 0;
          local_38[1] = 0x444e4549;
          local_38 = local_38 + 2;
          stbiw__wpcrc((uchar **)&local_38,0);
          if (local_38 == (uint *)(puVar5 + *piVar1)) {
            return puVar5;
          }
          __assert_fail("o == out + *out_len",
                        "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image_write.h"
                        ,0x4b9,
                        "unsigned char *stbi_write_png_to_mem(const unsigned char *, int, int, int, int, int *)"
                       );
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}